

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionIsAnInitiator::RunImpl
          (TestsessionFixtureSessionIsAnInitiator *this)

{
  TestDetails *details;
  sessionFixtureSessionIsAnInitiatorHelper fixtureHelper;
  sessionFixtureSessionIsAnInitiatorHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixtureSessionIsAnInitiatorHelper::sessionFixtureSessionIsAnInitiatorHelper
            (&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionIsAnInitiatorHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture(&local_660.super_sessionFixture);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionIsAnInitiator) {
  createSession(1);
  CHECK(object->isInitiator());
}